

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openreadclose.c
# Opt level: O2

int openreadclose(char *fn,stralloc *sa,uint bufsize)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = open_read(fn);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = -(uint)(*piVar2 != error_noent);
  }
  else {
    iVar1 = readclose(iVar1,sa,bufsize);
    iVar1 = (uint)(iVar1 != -1) * 2 + -1;
  }
  return iVar1;
}

Assistant:

int openreadclose(const char *fn,stralloc *sa,unsigned int bufsize)
{
  int fd;
  fd = open_read(fn);
  if (fd == -1) {
    if (errno == error_noent) return 0;
    return -1;
  }
  if (readclose(fd,sa,bufsize) == -1) return -1;
  return 1;
}